

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O3

int lws_h2_do_pps_send(lws *wsi)

{
  long lVar1;
  undefined1 *puVar2;
  lws_h2_netconn *plVar3;
  lws_h2_netconn *plVar4;
  anon_struct_8_2_43e7303c_for_rs aVar5;
  lws_h2_protocol_send *plVar6;
  lws_h2_protocol_send *plVar7;
  undefined1 uVar8;
  uint uVar9;
  lws *plVar10;
  lws_h2_protocol_send *plVar11;
  ulong uVar12;
  lws_h2_protocol_send **pplVar13;
  lws_h2_protocol_send *ptr;
  int iVar14;
  char *format;
  int iVar15;
  uint uVar16;
  long lVar17;
  uint8_t set [80];
  anon_struct_8_2_43e7303c_for_rs local_78;
  char local_70 [64];
  
  plVar3 = (wsi->h2).h2n;
  if (plVar3 == (lws_h2_netconn *)0x0) {
    return 1;
  }
  plVar6 = plVar3->pps;
  plVar7 = (lws_h2_protocol_send *)&plVar3->pps;
  ptr = (lws_h2_protocol_send *)(lws_h2_protocol_send **)0x0;
  while (pplVar13 = &plVar7->next, plVar11 = plVar6, plVar11 != (lws_h2_protocol_send *)0x0) {
    plVar6 = plVar11->next;
    plVar7 = plVar11;
    if (plVar11->next == (lws_h2_protocol_send *)0x0) {
      *pplVar13 = (lws_h2_protocol_send *)0x0;
      plVar6 = (lws_h2_protocol_send *)0x0;
      plVar7 = (lws_h2_protocol_send *)pplVar13;
      ptr = plVar11;
    }
  }
  if (ptr == (lws_h2_protocol_send *)0x0) {
    return 1;
  }
  iVar14 = 0;
  iVar15 = 0;
  _lws_log(8,"%s: %p: %d\n","lws_h2_do_pps_send",wsi);
  aVar5 = local_78;
  switch(*(http2_hpack_state *)((long)ptr + 8)) {
  case HPKS_IDX_EXT:
    lVar17 = 0;
    uVar16 = 0;
    do {
      if ((plVar3->our_set).s[lVar17 + 1] != lws_h2_defaults.s[lVar17 + 1]) {
        _lws_log(0x10,"sending SETTING %d 0x%x\n",lVar17 + 1U & 0xffffffff,
                 (ulong)(((wsi->h2).h2n)->our_set).s[lVar17 + 1]);
        local_70[(long)(int)uVar16 + -8] = '\0';
        local_70[(long)(int)uVar16 + -7] = (char)(lVar17 + 1U);
        plVar4 = (wsi->h2).h2n;
        local_70[(long)(int)uVar16 + -6] = *(char *)((long)(plVar4->our_set).s + lVar17 * 4 + 7);
        local_70[(long)(int)uVar16 + -5] = *(char *)((long)(plVar4->our_set).s + lVar17 * 4 + 6);
        local_70[(long)(int)uVar16 + -4] = *(char *)((long)(plVar4->our_set).s + lVar17 * 4 + 5);
        local_70[(long)(int)uVar16 + -3] = (char)(plVar4->our_set).s[lVar17 + 1];
        uVar16 = uVar16 + 6;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != 8);
    iVar14 = 0;
    uVar9 = lws_h2_frame_write(wsi,4,0,0,uVar16,(uchar *)&local_78);
    if (uVar9 == uVar16) goto switchD_0012c332_default;
    uVar12 = (ulong)uVar16;
    goto LAB_0012c6b4;
  case HPKS_HLEN:
    iVar14 = 0;
    uVar9 = lws_h2_frame_write(wsi,4,1,0,0,(uchar *)&local_78);
    if (uVar9 == 0) {
      wsi->field_0x2dc = wsi->field_0x2dc & 0xbf;
      if ((short)wsi->wsistate != 0x30d) goto switchD_0012c332_default;
      lwsi_set_state(wsi,0x119);
      (wsi->http).fop_fd = (lws_fop_fd_t)0x0;
      plVar10 = lws_get_network_wsi(wsi);
      iVar15 = lws_is_ssl(plVar10);
      if (iVar15 != 0) goto switchD_0012c332_default;
      plVar10 = lws_wsi_server_new(wsi->vhost,wsi,1);
      plVar3->swsi = plVar10;
      if (plVar10 != (lws *)0x0) {
        (plVar10->http).ah = (wsi->http).ah;
        (wsi->http).ah = (allocated_headers *)0x0;
        iVar14 = 0;
        _lws_log(8,"%s: inherited headers %p\n","lws_h2_do_pps_send",(plVar10->http).ah);
        (plVar3->swsi->txc).tx_cr = (plVar3->our_set).s[4];
        _lws_log(8,"initial tx credit on conn %p: %d\n");
        puVar2 = &(plVar3->swsi->h2).field_0x11;
        *puVar2 = *puVar2 | 0x10;
        puVar2 = &(plVar3->swsi->h2).field_0x11;
        *puVar2 = *puVar2 | 1;
        _lws_log(8,"servicing initial http request\n");
        iVar15 = lws_http_action(plVar3->swsi);
        if (iVar15 == 0) goto switchD_0012c332_default;
      }
    }
    else {
      _lws_log(1,"ack tells %d\n",(ulong)uVar9);
    }
    break;
  case HPKS_HLEN_EXT:
    format = "sending PING\n";
    goto LAB_0012c4ab;
  case HPKS_DATA:
    iVar15 = 1;
    format = "sending PONG\n";
LAB_0012c4ab:
    _lws_log(8,format);
    local_78 = *(anon_struct_8_2_43e7303c_for_rs *)((long)ptr + 0xc);
    iVar15 = lws_h2_frame_write(wsi,6,iVar15,0,8,(uchar *)&local_78);
    iVar14 = 0;
    if (iVar15 == 8) goto switchD_0012c332_default;
    break;
  case HPKS_DATA|HPKS_IDX_EXT:
    _lws_log(8,"LWS_H2_PPS_GOAWAY\n");
    uVar9 = *(uint32_t *)((long)ptr + 0x2c);
    iVar15 = (int)local_70;
    uVar16 = *(uint32_t *)((long)ptr + 0x30);
    local_78.err = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 |
                   uVar16 << 0x18;
    local_78.sid = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
    uVar8 = *(undefined1 *)((long)ptr + 0xc);
    if (uVar8 != HPKT_INDEXED_HDR_7) {
      lVar17 = 0;
      do {
        local_70[lVar17] = uVar8;
        uVar8 = *(char *)((long)ptr + lVar17 + 0xd);
        lVar1 = lVar17 + 1;
        if (uVar8 == HPKT_INDEXED_HDR_7) break;
        uVar9 = (uint)lVar17;
        lVar17 = lVar1;
      } while (uVar9 < 0x1f);
      iVar15 = iVar15 + (int)lVar1;
    }
    plVar3->field_0xa8 = plVar3->field_0xa8 | 0x20;
    uVar9 = lws_h2_frame_write(wsi,7,0,0,iVar15 - (int)&local_78,(uchar *)&local_78);
    if (uVar9 != 4) goto LAB_0012c6a4;
    break;
  case HPKS_DATA|HPKS_HLEN:
    iVar14 = 0;
    _lws_log(8,"LWS_H2_PPS_RST_STREAM\n");
    aVar5 = local_78;
    local_78.sid._1_1_ = *(undefined1 *)((long)ptr + 0x12);
    local_78.sid._0_1_ = *(undefined1 *)((long)ptr + 0x13);
    local_78.sid._2_1_ = *(undefined1 *)((long)ptr + 0x11);
    local_78.err = aVar5.err;
    local_78.sid._3_1_ = *(undefined1 *)((long)ptr + 0x10);
    uVar9 = lws_h2_frame_write(wsi,3,0,*(http2_hpack_type *)((long)ptr + 0xc),4,(uchar *)&local_78);
    if (uVar9 == 4) {
      plVar10 = lws_wsi_mux_from_id(wsi,*(http2_hpack_type *)((long)ptr + 0xc));
      if (plVar10 != (lws *)0x0) {
        iVar14 = 0;
        _lws_log(0x10,"%s: closing cwsi %p %s %s (wsi %p)\n","lws_h2_do_pps_send",plVar10,
                 plVar10->role_ops->name,plVar10->protocol->name,wsi);
        lws_close_free_wsi(plVar10,LWS_CLOSE_STATUS_NOSTATUS,"reset stream");
      }
      goto switchD_0012c332_default;
    }
    goto LAB_0012c6a4;
  case HPKS_DATA|HPKS_HLEN_EXT:
    iVar14 = 0;
    _lws_log(8,"Issuing LWS_H2_PPS_UPDATE_WINDOW: sid %d: add %d\n",
             (ulong)*(http2_hpack_type *)((long)ptr + 0xc),(ulong)*(uint *)((long)ptr + 0x10));
    local_78 = (anon_struct_8_2_43e7303c_for_rs)
               (CONCAT71(local_78._1_7_,*(undefined1 *)((long)ptr + 0x13)) & 0xffffffffffffff7f);
    aVar5 = local_78;
    local_78.sid._1_1_ = *(undefined1 *)((long)ptr + 0x12);
    local_78.sid._2_1_ = *(undefined1 *)((long)ptr + 0x11);
    local_78.err = aVar5.err;
    local_78.sid._3_1_ = *(undefined1 *)((long)ptr + 0x10);
    uVar9 = lws_h2_frame_write(wsi,8,0,*(http2_hpack_type *)((long)ptr + 0xc),4,(uchar *)&local_78);
    if (uVar9 == 4) goto switchD_0012c332_default;
    goto LAB_0012c6a4;
  case 8:
    local_78.sid._2_1_ = *(undefined1 *)((long)ptr + 0x13);
    local_78.sid._0_2_ = 0x400;
    local_78.sid._3_1_ = *(undefined1 *)((long)ptr + 0x12);
    local_78.err._0_1_ = *(undefined1 *)((long)ptr + 0x11);
    local_78.err._2_2_ = aVar5.err._2_2_;
    local_78.err._1_1_ = *(undefined1 *)((long)ptr + 0x10);
    iVar14 = 0;
    _lws_log(0x10,"%s: resetting initial window to %d\n","lws_h2_do_pps_send");
    uVar9 = lws_h2_frame_write(wsi,4,0,0,6,(uchar *)&local_78);
    if (uVar9 == 6) goto switchD_0012c332_default;
LAB_0012c6a4:
    uVar12 = 0;
LAB_0012c6b4:
    _lws_log(8,"send %d %d\n",(ulong)uVar9,uVar12);
    break;
  default:
    goto switchD_0012c332_default;
  }
  iVar14 = 1;
switchD_0012c332_default:
  lws_realloc(ptr,0,"lws_free");
  return iVar14;
}

Assistant:

int lws_h2_do_pps_send(struct lws *wsi)
{
	struct lws_h2_netconn *h2n = wsi->h2.h2n;
	struct lws_h2_protocol_send *pps = NULL;
	struct lws *cwsi;
	uint8_t set[LWS_PRE + 64], *p = &set[LWS_PRE], *q;
	int n, m = 0, flags = 0;

	if (!h2n)
		return 1;

	/* get the oldest pps */

	lws_start_foreach_llp(struct lws_h2_protocol_send **, pps1, h2n->pps) {
		if ((*pps1)->next == NULL) { /* we are the oldest in the list */
			pps = *pps1; /* remove us from the list */
			*pps1 = NULL;
			continue;
		}
	} lws_end_foreach_llp(pps1, next);

	if (!pps)
		return 1;

	lwsl_info("%s: %p: %d\n", __func__, wsi, pps->type);

	switch (pps->type) {

	case LWS_H2_PPS_MY_SETTINGS:

		/*
		 * if any of our settings varies from h2 "default defaults"
		 * then we must inform the peer
		 */
		for (n = 1; n < H2SET_COUNT; n++)
			if (h2n->our_set.s[n] != lws_h2_defaults.s[n]) {
				lwsl_debug("sending SETTING %d 0x%x\n", n,
					   (unsigned int)
						   wsi->h2.h2n->our_set.s[n]);

				lws_h2_set_bin(wsi, n, &set[LWS_PRE + m]);
				m += sizeof(h2n->one_setting);
			}
		n = lws_h2_frame_write(wsi, LWS_H2_FRAME_TYPE_SETTINGS,
				       flags, LWS_H2_STREAM_ID_MASTER, m,
		     		       &set[LWS_PRE]);
		if (n != m) {
			lwsl_info("send %d %d\n", n, m);
			goto bail;
		}
		break;

	case LWS_H2_PPS_SETTINGS_INITIAL_UPDATE_WINDOW:
		q = &set[LWS_PRE];
		*q++ = H2SET_INITIAL_WINDOW_SIZE >> 8;
		*q++ = H2SET_INITIAL_WINDOW_SIZE;
		*q++ = pps->u.update_window.credit >> 24;
		*q++ = pps->u.update_window.credit >> 16;
		*q++ = pps->u.update_window.credit >> 8;
		*q = pps->u.update_window.credit;

		lwsl_debug("%s: resetting initial window to %d\n", __func__,
				(int)pps->u.update_window.credit);

		n = lws_h2_frame_write(wsi, LWS_H2_FRAME_TYPE_SETTINGS,
				       flags, LWS_H2_STREAM_ID_MASTER, 6,
		     		       &set[LWS_PRE]);
		if (n != 6) {
			lwsl_info("send %d %d\n", n, m);
			goto bail;
		}
		break;

	case LWS_H2_PPS_ACK_SETTINGS:
		/* send ack ... always empty */
		n = lws_h2_frame_write(wsi, LWS_H2_FRAME_TYPE_SETTINGS, 1,
				       LWS_H2_STREAM_ID_MASTER, 0,
				       &set[LWS_PRE]);
		if (n) {
			lwsl_err("ack tells %d\n", n);
			goto bail;
		}
		wsi->h2_acked_settings = 0;
		/* this is the end of the preface dance then? */
		if (lwsi_state(wsi) == LRS_H2_AWAIT_SETTINGS) {
			lwsi_set_state(wsi, LRS_ESTABLISHED);
#if defined(LWS_WITH_FILE_OPS)
			wsi->http.fop_fd = NULL;
#endif
			if (lws_is_ssl(lws_get_network_wsi(wsi)))
				break;
			/*
			 * we need to treat the headers from the upgrade as the
			 * first job.  So these need to get shifted to sid 1.
			 */
			h2n->swsi = lws_wsi_server_new(wsi->vhost, wsi, 1);
			if (!h2n->swsi)
				goto bail;

			/* pass on the initial headers to SID 1 */
			h2n->swsi->http.ah = wsi->http.ah;
			wsi->http.ah = NULL;

			lwsl_info("%s: inherited headers %p\n", __func__,
				  h2n->swsi->http.ah);
			h2n->swsi->txc.tx_cr =
				h2n->our_set.s[H2SET_INITIAL_WINDOW_SIZE];
			lwsl_info("initial tx credit on conn %p: %d\n",
				  h2n->swsi, (int)h2n->swsi->txc.tx_cr);
			h2n->swsi->h2.initialized = 1;
			/* demanded by HTTP2 */
			h2n->swsi->h2.END_STREAM = 1;
			lwsl_info("servicing initial http request\n");

#if defined(LWS_WITH_SERVER_STATUS)
			wsi->vhost->conn_stats.h2_trans++;
#endif
#if defined(LWS_WITH_SERVER)
			if (lws_http_action(h2n->swsi))
				goto bail;
#endif
			break;
		}
		break;

	/*
	 * h2 only has PING... ACK = 0 = ping, ACK = 1 = pong
	 */

	case LWS_H2_PPS_PING:
	case LWS_H2_PPS_PONG:
		if (pps->type == LWS_H2_PPS_PING)
			lwsl_info("sending PING\n");
		else {
			lwsl_info("sending PONG\n");
			flags = LWS_H2_FLAG_SETTINGS_ACK;
		}

		memcpy(&set[LWS_PRE], pps->u.ping.ping_payload, 8);
		n = lws_h2_frame_write(wsi, LWS_H2_FRAME_TYPE_PING, flags,
				       LWS_H2_STREAM_ID_MASTER, 8,
				       &set[LWS_PRE]);
		if (n != 8)
			goto bail;

		break;

	case LWS_H2_PPS_GOAWAY:
		lwsl_info("LWS_H2_PPS_GOAWAY\n");
		*p++ = pps->u.ga.highest_sid >> 24;
		*p++ = pps->u.ga.highest_sid >> 16;
		*p++ = pps->u.ga.highest_sid >> 8;
		*p++ = pps->u.ga.highest_sid;
		*p++ = pps->u.ga.err >> 24;
		*p++ = pps->u.ga.err >> 16;
		*p++ = pps->u.ga.err >> 8;
		*p++ = pps->u.ga.err;
		q = (unsigned char *)pps->u.ga.str;
		n = 0;
		while (*q && n++ < (int)sizeof(pps->u.ga.str))
			*p++ = *q++;
		h2n->we_told_goaway = 1;
		n = lws_h2_frame_write(wsi, LWS_H2_FRAME_TYPE_GOAWAY, 0,
				       LWS_H2_STREAM_ID_MASTER,
				       lws_ptr_diff(p, &set[LWS_PRE]),
				       &set[LWS_PRE]);
		if (n != 4) {
			lwsl_info("send %d %d\n", n, m);
			goto bail;
		}
		goto bail;

	case LWS_H2_PPS_RST_STREAM:
		lwsl_info("LWS_H2_PPS_RST_STREAM\n");
		*p++ = pps->u.rs.err >> 24;
		*p++ = pps->u.rs.err >> 16;
		*p++ = pps->u.rs.err >> 8;
		*p++ = pps->u.rs.err;
		n = lws_h2_frame_write(wsi, LWS_H2_FRAME_TYPE_RST_STREAM,
				       0, pps->u.rs.sid, 4, &set[LWS_PRE]);
		if (n != 4) {
			lwsl_info("send %d %d\n", n, m);
			goto bail;
		}
		cwsi = lws_wsi_mux_from_id(wsi, pps->u.rs.sid);
		if (cwsi) {
			lwsl_debug("%s: closing cwsi %p %s %s (wsi %p)\n",
				   __func__, cwsi, cwsi->role_ops->name,
				   cwsi->protocol->name, wsi);
			lws_close_free_wsi(cwsi, 0, "reset stream");
		}
		break;

	case LWS_H2_PPS_UPDATE_WINDOW:
		lwsl_info("Issuing LWS_H2_PPS_UPDATE_WINDOW: sid %d: add %d\n",
			    (int)pps->u.update_window.sid,
			    (int)pps->u.update_window.credit);
		*p++ = (pps->u.update_window.credit >> 24) & 0x7f; /* 31b */
		*p++ = pps->u.update_window.credit >> 16;
		*p++ = pps->u.update_window.credit >> 8;
		*p++ = pps->u.update_window.credit;
		n = lws_h2_frame_write(wsi, LWS_H2_FRAME_TYPE_WINDOW_UPDATE,
				       0, pps->u.update_window.sid, 4,
				       &set[LWS_PRE]);
		if (n != 4) {
			lwsl_info("send %d %d\n", n, m);
			goto bail;
		}
		break;

	default:
		break;
	}

	lws_free(pps);

	return 0;

bail:
	lws_free(pps);

	return 1;
}